

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::setTimeBarrier(CoreBroker *this,Time barrierTime)

{
  ActionMessage tbarrier;
  
  if (barrierTime.internalTimeCode == 0x7fffffffffffffff) {
    clearTimeBarrier(this);
    return;
  }
  ActionMessage::ActionMessage(&tbarrier,cmd_time_barrier_request);
  tbarrier.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  tbarrier.actionTime.internalTimeCode = barrierTime.internalTimeCode;
  BrokerBase::addActionMessage(&this->super_BrokerBase,&tbarrier);
  ActionMessage::~ActionMessage(&tbarrier);
  return;
}

Assistant:

void CoreBroker::setTimeBarrier(Time barrierTime)
{
    if (barrierTime == Time::maxVal()) {
        return clearTimeBarrier();
    }
    ActionMessage tbarrier(CMD_TIME_BARRIER_REQUEST);
    tbarrier.source_id = global_id.load();
    tbarrier.actionTime = barrierTime;
    addActionMessage(tbarrier);
}